

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.h
# Opt level: O1

Accessor * __thiscall
Assimp::ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
          (ColladaParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
          *pLibrary,string *pURL)

{
  const_iterator cVar1;
  string local_1b0;
  ostringstream local_190 [376];
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
          ::find(&pLibrary->_M_t,pURL);
  if ((_Rb_tree_header *)cVar1._M_node != &(pLibrary->_M_t)._M_impl.super__Rb_tree_header) {
    return (Accessor *)(cVar1._M_node + 2);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Unable to resolve library reference \"",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(pURL->_M_dataplus)._M_p,pURL->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\".",2);
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1b0);
}

Assistant:

const Type& ColladaParser::ResolveLibraryReference( const std::map<std::string, Type>& pLibrary, const std::string& pURL) const
    {
        typename std::map<std::string, Type>::const_iterator it = pLibrary.find( pURL);
        if( it == pLibrary.end())
            ThrowException( Formatter::format() << "Unable to resolve library reference \"" << pURL << "\"." );
        return it->second;
    }